

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap_str.c
# Opt level: O0

char * ap_str_trim_from_set(char *str,char *set)

{
  char *str_00;
  char *set_local;
  char *str_local;
  
  set_local = str;
  if ((str != (char *)0x0) && (set != (char *)0x0)) {
    str_00 = ap_str_trim_head_from_set(str,set);
    set_local = ap_str_trim_tail_from_set(str_00,set);
  }
  return set_local;
}

Assistant:

char * ap_str_trim_from_set (char *str, const char *set)
{
	if (str == NULL || set == NULL)
	{
		goto finish;
	}

	str = ap_str_trim_head_from_set (str, set);
	str = ap_str_trim_tail_from_set (str, set);

finish:
	return str;
}